

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O2

void __thiscall duckdb::ChunkVectorInfo::Write(ChunkVectorInfo *this,WriteStream *writer)

{
  idx_t iVar1;
  idx_t row_idx;
  idx_t i;
  idx_t iVar2;
  ValidityMask mask;
  SelectionVector sel;
  
  SelectionVector::SelectionVector(&sel,0x800);
  iVar1 = TemplatedGetSelVector<duckdb::TransactionVersionOperator>
                    (this,0x400000000000005f,0xffffffffffffffff,&sel,0x800);
  if (iVar1 == 0) {
    mask.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)
         ((ulong)mask.super_TemplatedValidityMask<unsigned_long>.validity_mask._1_7_ << 8);
    (**writer->_vptr_WriteStream)(writer,&mask,1);
    mask.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)(this->super_ChunkInfo).start;
    (**writer->_vptr_WriteStream)(writer,&mask,8);
  }
  else if (iVar1 == 0x800) {
    mask.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)
         CONCAT71(mask.super_TemplatedValidityMask<unsigned_long>.validity_mask._1_7_,2);
    (**writer->_vptr_WriteStream)(writer,&mask,1);
  }
  else {
    ChunkInfo::Write(&this->super_ChunkInfo,writer);
    mask.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)(this->super_ChunkInfo).start;
    (**writer->_vptr_WriteStream)(writer,&mask,8);
    mask.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
    mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    mask.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
    TemplatedValidityMask<unsigned_long>::Initialize
              (&mask.super_TemplatedValidityMask<unsigned_long>,0x800);
    for (iVar2 = 0; iVar1 != iVar2; iVar2 = iVar2 + 1) {
      row_idx = iVar2;
      if (sel.sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)sel.sel_vector[iVar2];
      }
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&mask.super_TemplatedValidityMask<unsigned_long>,row_idx);
    }
    ValidityMask::Write(&mask,writer,0x800);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void ChunkVectorInfo::Write(WriteStream &writer) const {
	SelectionVector sel(STANDARD_VECTOR_SIZE);
	transaction_t start_time = TRANSACTION_ID_START - 1;
	transaction_t transaction_id = DConstants::INVALID_INDEX;
	idx_t count = GetSelVector(start_time, transaction_id, sel, STANDARD_VECTOR_SIZE);
	if (count == STANDARD_VECTOR_SIZE) {
		// nothing is deleted: skip writing anything
		writer.Write<ChunkInfoType>(ChunkInfoType::EMPTY_INFO);
		return;
	}
	if (count == 0) {
		// everything is deleted: write a constant vector
		writer.Write<ChunkInfoType>(ChunkInfoType::CONSTANT_INFO);
		writer.Write<idx_t>(start);
		return;
	}
	// write a boolean vector
	ChunkInfo::Write(writer);
	writer.Write<idx_t>(start);
	ValidityMask mask(STANDARD_VECTOR_SIZE);
	mask.Initialize(STANDARD_VECTOR_SIZE);
	for (idx_t i = 0; i < count; i++) {
		mask.SetInvalid(sel.get_index(i));
	}
	mask.Write(writer, STANDARD_VECTOR_SIZE);
}